

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O2

double double_conversion::StrtodTrimmed(Vector<const_char> trimmed,int exponent)

{
  bool bVar1;
  int iVar2;
  undefined4 in_register_00000014;
  double *in_R8;
  DiyFp DVar3;
  DiyFp diy_fp;
  Vector<const_char> trimmed_00;
  Vector<const_char> buffer;
  double guess;
  Double local_28;
  double local_20;
  
  trimmed_00._12_4_ = in_register_00000014;
  trimmed_00.length_ = exponent;
  trimmed_00.start_ = trimmed._8_8_;
  buffer.start_ = (double_conversion *)trimmed.start_;
  bVar1 = ComputeGuess(buffer.start_,trimmed_00,(int)&local_20,in_R8);
  if (!bVar1) {
    local_28.d64_ = (uint64_t)local_20;
    DVar3 = Double::UpperBoundary(&local_28);
    buffer._8_8_ = (ulong)trimmed_00.start_ & 0xffffffff;
    diy_fp._12_4_ = 0;
    diy_fp.f_ = SUB128(DVar3._0_12_,0);
    diy_fp.e_ = SUB124(DVar3._0_12_,8);
    iVar2 = CompareBufferWithDiyFp(buffer,exponent,diy_fp);
    if ((-1 < iVar2) && ((iVar2 != 0 || (((ulong)local_20 & 1) != 0)))) {
      local_20 = Double::NextDouble(&local_28);
    }
  }
  return local_20;
}

Assistant:

double StrtodTrimmed(Vector<const char> trimmed, int exponent) {
  DOUBLE_CONVERSION_ASSERT(trimmed.length() <= kMaxSignificantDecimalDigits);
  DOUBLE_CONVERSION_ASSERT(AssertTrimmedDigits(trimmed));
  double guess;
  const bool is_correct = ComputeGuess(trimmed, exponent, &guess);
  if (is_correct) {
    return guess;
  }
  DiyFp upper_boundary = Double(guess).UpperBoundary();
  int comparison = CompareBufferWithDiyFp(trimmed, exponent, upper_boundary);
  if (comparison < 0) {
    return guess;
  } else if (comparison > 0) {
    return Double(guess).NextDouble();
  } else if ((Double(guess).Significand() & 1) == 0) {
    // Round towards even.
    return guess;
  } else {
    return Double(guess).NextDouble();
  }
}